

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

int nn_bus_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase *self_00;
  nn_bus *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_sockbase *)nn_alloc_(0x1b0);
  if (self_00 == (nn_sockbase *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/bus/bus.c"
            ,0x7d);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_bus_init((nn_bus *)self_00,&nn_bus_sockbase_vfptr,hint);
  *sockbase = self_00;
  return 0;
}

Assistant:

static int nn_bus_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_bus *self;

    self = nn_alloc (sizeof (struct nn_bus), "socket (bus)");
    alloc_assert (self);
    nn_bus_init (self, &nn_bus_sockbase_vfptr, hint);
    *sockbase = &self->xbus.sockbase;

    return 0;
}